

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_base_z2_row_access<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
               (void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  bool bVar1;
  reference witness;
  column_content<typename_Matrix<Base_options_with_row_access<true,_(Column_types)7,_false,_true,_false,_true>_>::Column>
  local_288;
  reference local_258;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  allocator<unsigned_int> local_22d;
  uint i;
  iterator local_228;
  size_type local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  allocator<unsigned_int> local_1f9;
  uint local_1f8 [6];
  iterator local_1e0;
  size_type local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d0;
  allocator<unsigned_int> local_1b5;
  uint local_1b4;
  iterator local_1b0;
  size_type local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  allocator<unsigned_int> local_181;
  uint local_180 [2];
  iterator local_178;
  size_type local_170;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  allocator<unsigned_int> local_149;
  uint local_148 [8];
  iterator local_128;
  size_type local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  allocator<unsigned_int> local_f9;
  uint local_f8 [6];
  iterator local_e0;
  size_type local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  undefined1 local_b8 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  undefined1 local_90 [8];
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>
              *)local_90,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_b8);
  local_f8[0] = 3;
  local_f8[1] = 6;
  local_f8[2] = 9;
  local_f8[3] = 10;
  local_f8[4] = 0xb;
  local_e0 = local_f8;
  local_d8 = 5;
  std::allocator<unsigned_int>::allocator(&local_f9);
  __l_04._M_len = local_d8;
  __l_04._M_array = local_e0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d0,__l_04,&local_f9);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_b8,&local_d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_d0);
  std::allocator<unsigned_int>::~allocator(&local_f9);
  local_148[0] = 3;
  local_148[1] = 5;
  local_148[2] = 8;
  local_148[3] = 9;
  local_148[4] = 0xb;
  local_128 = local_148;
  local_120 = 5;
  std::allocator<unsigned_int>::allocator(&local_149);
  __l_03._M_len = local_120;
  __l_03._M_array = local_128;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_118,__l_03,&local_149);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_b8,&local_118);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_118);
  std::allocator<unsigned_int>::~allocator(&local_149);
  local_180[0] = 5;
  local_180[1] = 8;
  local_178 = local_180;
  local_170 = 2;
  std::allocator<unsigned_int>::allocator(&local_181);
  __l_02._M_len = local_170;
  __l_02._M_array = local_178;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_168,__l_02,&local_181);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_b8,&local_168);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_168);
  std::allocator<unsigned_int>::~allocator(&local_181);
  local_1b4 = 7;
  local_1b0 = &local_1b4;
  local_1a8 = 1;
  std::allocator<unsigned_int>::allocator(&local_1b5);
  __l_01._M_len = local_1a8;
  __l_01._M_array = local_1b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1a0,__l_01,&local_1b5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_b8,&local_1a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a0);
  std::allocator<unsigned_int>::~allocator(&local_1b5);
  local_1f8[4] = 10;
  local_1f8[5] = 0xb;
  local_1f8[0] = 3;
  local_1f8[1] = 6;
  local_1f8[2] = 7;
  local_1f8[3] = 9;
  local_1e0 = local_1f8;
  local_1d8 = 6;
  std::allocator<unsigned_int>::allocator(&local_1f9);
  __l_00._M_len = local_1d8;
  __l_00._M_array = local_1e0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1d0,__l_00,&local_1f9);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_b8,&local_1d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1d0);
  std::allocator<unsigned_int>::~allocator(&local_1f9);
  i = 7;
  local_228 = &i;
  local_220 = 1;
  std::allocator<unsigned_int>::allocator(&local_22d);
  __l._M_len = local_220;
  __l._M_array = local_228;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_218,__l,&local_22d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_b8,&local_218);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_218);
  std::allocator<unsigned_int>::~allocator(&local_22d);
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_b8);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&r);
    if (!bVar1) break;
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end1);
    local_258 = witness;
    get_ordered_row<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
              (&local_288,
               (Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                *)local_90,__range1._4_4_);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
              (witness,&local_288);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_288)
    ;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_b8);
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
  ::~Matrix((Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
             *)local_90);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_base_z2_row_access() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<std::vector<unsigned int> > rows;
  if constexpr (Matrix::Option_list::has_column_compression) {
    // if the union find structure changes, the column_index values of the entries could also change. Change the test
    // with all possibilities?
    rows.push_back({3, 6});
    rows.push_back({3, 5});
    rows.push_back({5});
    rows.push_back({7});
    rows.push_back({3, 6, 7});
    rows.push_back({7});
  } else {
    rows.push_back({3, 6, 9, 10, 11});
    rows.push_back({3, 5, 8, 9, 11});
    rows.push_back({5, 8});
    rows.push_back({7});
    rows.push_back({3, 6, 7, 9, 10, 11});
    rows.push_back({7});
  }

  unsigned int i = 0;
  for (auto& r : rows) {
    test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
  }
}